

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# task_data.h
# Opt level: O0

void __thiscall BindData::BindData(BindData *this,string *inside,string *outside,int flags)

{
  ulong uVar1;
  size_type sVar2;
  ContextManager *pCVar3;
  undefined8 uVar4;
  string local_78;
  string local_48;
  int local_24;
  string *psStack_20;
  int flags_local;
  string *outside_local;
  string *inside_local;
  BindData *this_local;
  
  local_24 = flags;
  psStack_20 = outside;
  outside_local = inside;
  inside_local = (string *)this;
  PlainString<4096UL>::PlainString(&this->inside_);
  PlainString<4096UL>::PlainString(&this->outside_);
  uVar1 = std::__cxx11::string::size();
  sVar2 = PlainString<4096UL>::max_size(&this->inside_);
  if (sVar2 < uVar1) {
    pCVar3 = ContextManager::get();
    uVar4 = std::__cxx11::string::size();
    sVar2 = PlainString<4096UL>::max_size(&this->inside_);
    format_abi_cxx11_(&local_48,"bind inside path is larger that maximum (%zi > %zi)",uVar4,sVar2);
    (**pCVar3->_vptr_ContextManager)(pCVar3,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
  }
  uVar1 = std::__cxx11::string::size();
  sVar2 = PlainString<4096UL>::max_size(&this->outside_);
  if (sVar2 < uVar1) {
    pCVar3 = ContextManager::get();
    uVar4 = std::__cxx11::string::size();
    sVar2 = PlainString<4096UL>::max_size(&this->outside_);
    format_abi_cxx11_(&local_78,"bind outsize path is larger that maximum (%zi > %zi)",uVar4,sVar2);
    (**pCVar3->_vptr_ContextManager)(pCVar3,&local_78);
    std::__cxx11::string::~string((string *)&local_78);
  }
  PlainString<4096UL>::operator=(&this->inside_,outside_local);
  PlainString<4096UL>::operator=(&this->outside_,psStack_20);
  this->flags_ = local_24;
  return;
}

Assistant:

BindData(const std::string &inside, const std::string &outside, int flags) {
        if (inside.size() > inside_.max_size()) {
            die(format("bind inside path is larger that maximum (%zi > %zi)", inside.size(), inside_.max_size()));
        }
        if (outside.size() > outside_.max_size()) {
            die(format("bind outsize path is larger that maximum (%zi > %zi)", outside.size(), outside_.max_size()));
        }
        inside_ = inside;
        outside_ = outside;
        flags_ = flags;
    }